

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

LatticeComparison __thiscall
wasm::analysis::Vector<wasm::RandomLattice>::compare
          (Vector<wasm::RandomLattice> *this,Element *a,Element *b)

{
  LatticeComparison LVar1;
  ulong uVar2;
  LatticeComparison LVar3;
  long lVar4;
  bool bVar5;
  
  if ((long)(a->
            super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(a->
            super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 4 != this->size) {
    __assert_fail("a.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x36,
                  "LatticeComparison wasm::analysis::Vector<wasm::RandomLattice>::compare(const Element &, const Element &) const [L = wasm::RandomLattice]"
                 );
  }
  if ((long)(b->
            super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(b->
            super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 4 != this->size) {
    __assert_fail("b.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x37,
                  "LatticeComparison wasm::analysis::Vector<wasm::RandomLattice>::compare(const Element &, const Element &) const [L = wasm::RandomLattice]"
                 );
  }
  if (this->size == 0) {
    LVar3 = EQUAL;
  }
  else {
    LVar3 = EQUAL;
    lVar4 = 0;
    uVar2 = 0;
    do {
      LVar1 = RandomLattice::compare
                        (&this->lattice,
                         (Element *)
                         ((long)&(((a->
                                   super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                 super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar4),
                         (Element *)
                         ((long)&(((b->
                                   super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                 super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar4));
      if (LVar1 == LESS) {
        bVar5 = LVar3 == GREATER;
        LVar3 = LESS;
LAB_001a8ea3:
        if (bVar5) {
          return NO_RELATION;
        }
      }
      else {
        if (LVar1 == GREATER) {
          bVar5 = LVar3 == LESS;
          LVar3 = GREATER;
          goto LAB_001a8ea3;
        }
        if (LVar1 == NO_RELATION) {
          return NO_RELATION;
        }
      }
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar2 < this->size);
  }
  return LVar3;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    assert(a.size() == size);
    assert(b.size() == size);
    auto result = EQUAL;
    for (size_t i = 0; i < size; ++i) {
      switch (lattice.compare(a[i], b[i])) {
        case NO_RELATION:
          return NO_RELATION;
        case EQUAL:
          continue;
        case LESS:
          if (result == GREATER) {
            // Cannot be both less and greater.
            return NO_RELATION;
          }
          result = LESS;
          continue;
        case GREATER:
          if (result == LESS) {
            // Cannot be both greater and less.
            return NO_RELATION;
          }
          result = GREATER;
          continue;
      }
    }
    return result;
  }